

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O3

int libj1939_add_socket_to_epoll(int epoll_fd,int sock,uint32_t events)

{
  int iVar1;
  int iVar2;
  int local_18;
  uint32_t local_14;
  int local_10;
  undefined4 local_c;
  
  local_c = 0;
  local_14 = events;
  local_10 = sock;
  iVar1 = epoll_ctl(epoll_fd,1,sock,(epoll_event *)&local_14);
  iVar2 = 0;
  if (iVar1 < 0) {
    libj1939_add_socket_to_epoll_cold_1();
    iVar2 = local_18;
  }
  return iVar2;
}

Assistant:

int libj1939_add_socket_to_epoll(int epoll_fd, int sock, uint32_t events)
{
	struct epoll_event ev = {0};
	int ret;

	ev.events = events;
	ev.data.fd = sock;

	ret = epoll_ctl(epoll_fd, EPOLL_CTL_ADD, sock, &ev);
	if (ret < 0) {
		ret = errno;
		pr_err("epoll_ctl(EPOLL_CTL_ADD): %d (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}